

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O3

void VW::copy_example_metadata(bool param_1,example *dst,example *src)

{
  char *_begin;
  features *this;
  
  v_array<char>::clear(&dst->tag);
  _begin = (src->tag)._begin;
  push_many<char>(&dst->tag,_begin,(long)(src->tag)._end - (long)_begin);
  dst->example_counter = src->example_counter;
  (dst->super_example_predict).ft_offset = (src->super_example_predict).ft_offset;
  dst->partial_prediction = src->partial_prediction;
  if (src->passthrough == (features *)0x0) {
    dst->passthrough = (features *)0x0;
  }
  else {
    this = (features *)operator_new(0x68);
    (this->values)._begin = (float *)0x0;
    (this->values)._end = (float *)0x0;
    (this->values).end_array = (float *)0x0;
    (this->values).erase_count = 0;
    (this->indicies)._begin = (unsigned_long *)0x0;
    (this->indicies)._end = (unsigned_long *)0x0;
    (this->indicies).end_array = (unsigned_long *)0x0;
    (this->indicies).erase_count = 0;
    (this->space_names)._begin =
         (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (this->space_names)._end =
         (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (this->space_names).end_array =
         (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (this->space_names).erase_count = 0;
    this->sum_feat_sq = 0.0;
    dst->passthrough = this;
    features::deep_copy_from(this,src->passthrough);
  }
  dst->loss = src->loss;
  dst->weight = src->weight;
  dst->confidence = src->confidence;
  dst->test_only = src->test_only;
  dst->end_pass = src->end_pass;
  dst->sorted = src->sorted;
  dst->in_use = src->in_use;
  return;
}

Assistant:

void copy_example_metadata(bool /* audit */, example* dst, example* src)
{
  copy_array(dst->tag, src->tag);
  dst->example_counter = src->example_counter;

  dst->ft_offset = src->ft_offset;

  dst->partial_prediction = src->partial_prediction;
  if (src->passthrough == nullptr)
    dst->passthrough = nullptr;
  else
  {
    dst->passthrough = new features;
    dst->passthrough->deep_copy_from(*src->passthrough);
  }
  dst->loss = src->loss;
  dst->weight = src->weight;
  dst->confidence = src->confidence;
  dst->test_only = src->test_only;
  dst->end_pass = src->end_pass;
  dst->sorted = src->sorted;
  dst->in_use = src->in_use;
}